

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O3

Cut_Cut_t * Cut_CutStart(Cut_Oracle_t *p)

{
  Cut_Cut_t *pCVar1;
  uint uVar2;
  
  pCVar1 = (Cut_Cut_t *)Extra_MmFixedEntryFetch(p->pMmCuts);
  *(undefined8 *)pCVar1 = 0;
  pCVar1->uCanon0 = 0;
  pCVar1->uCanon1 = 0;
  pCVar1->pNext = (Cut_Cut_t *)0x0;
  uVar2 = (p->pParams->nVarsMax & 0xfU) << 0x18;
  *(uint *)pCVar1 = uVar2;
  *(uint *)pCVar1 = (p->fSimul & 1U) << 0x16 | uVar2;
  p->nCuts = p->nCuts + 1;
  return pCVar1;
}

Assistant:

Cut_Cut_t * Cut_CutStart( Cut_Oracle_t * p )
{
    Cut_Cut_t * pCut;
    // cut allocation
    pCut = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
    memset( pCut, 0, sizeof(Cut_Cut_t) );
    pCut->nVarsMax   = p->pParams->nVarsMax;
    pCut->fSimul     = p->fSimul;
    p->nCuts++;
    return pCut;
}